

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O2

R_conflict2 fullConvertCase(char32_t uc,Case which)

{
  short sVar1;
  R_conflict RVar2;
  Properties *pPVar3;
  long lVar4;
  char16_t *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  R_conflict2 RVar7;
  char16_t local_2c [2];
  char16_t local_28 [4];
  undefined2 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar3 = QUnicodeTables::qGetProp(uc);
  local_28 = (char16_t  [4])&DAT_aaaaaaaaaaaaaaaa;
  local_20 = 0xaaaa;
  sVar1 = (short)((uint)(int)(short)pPVar3->cases[which] >> 1);
  if (((ushort)pPVar3->cases[which] & 1) == 0) {
    RVar2 = QChar::fromUcs4(sVar1 + uc);
    local_2c[0] = RVar2.chars[0];
    local_2c[1] = RVar2.chars[1];
    for (lVar4 = 0; (ulong)(0xffff < (uint)RVar2.chars) * 2 + 2 != lVar4; lVar4 = lVar4 + 2) {
      *(undefined2 *)((long)local_28 + lVar4) = *(undefined2 *)((long)local_2c + lVar4);
    }
    pcVar5 = (char16_t *)((long)local_28 + lVar4);
  }
  else {
    lVar4 = (long)sVar1 * 2;
    sVar1 = *(short *)(QUnicodeTables::specialCaseMap + lVar4);
    pcVar5 = local_28;
    for (lVar6 = 0; sVar1 != (short)lVar6; lVar6 = lVar6 + 1) {
      *pcVar5 = *(char16_t *)(lVar4 + 0x16bbe2 + lVar6 * 2);
      pcVar5 = pcVar5 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    RVar7._8_2_ = (undefined2)((uint)((int)pcVar5 - (int)local_28) >> 1);
    RVar7.chars[0] = local_28[0];
    RVar7.chars[1] = local_28[1];
    RVar7.chars[2] = local_28[2];
    RVar7.chars[3] = local_28[3];
    return RVar7;
  }
  __stack_chk_fail();
}

Assistant:

static auto fullConvertCase(char32_t uc, QUnicodeTables::Case which) noexcept
{
    struct R {
        char16_t chars[MaxSpecialCaseLength + 1];
        qint8 sz;

        // iterable
        auto begin() const { return chars; }
        auto end() const { return chars + sz; }
        // QStringView-compatible
        auto data() const { return chars; }
        auto size() const { return sz; }
    } result;
    Q_ASSERT(uc <= QChar::LastValidCodePoint);

    auto pp = result.chars;

    const auto fold = qGetProp(uc)->cases[which];
    const auto caseDiff = fold.diff;

    if (Q_UNLIKELY(fold.special)) {
        const auto *specialCase = specialCaseMap + caseDiff;
        auto length = *specialCase++;
        while (length--)
            *pp++ = *specialCase++;
    } else {
        // so far, case conversion never changes planes (guaranteed by the qunicodetables generator)
        for (char16_t c : QChar::fromUcs4(uc + caseDiff))
            *pp++ = c;
    }
    result.sz = pp - result.chars;
    return result;
}